

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowStackToolWindow(bool *p_open)

{
  bool *v;
  uint uVar1;
  ImGuiWindow *pIVar2;
  _func_void_void_ptr_char_ptr *p_Var3;
  ImGuiStackLevelInfo *pIVar4;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImU32 color;
  char *pcVar11;
  char cVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  ImGuiContext *g;
  char *pcVar20;
  float fVar21;
  char level_desc [256];
  ImVec4 local_138 [16];
  
  pIVar8 = GImGui;
  uVar1 = (GImGui->NextWindowData).Flags;
  if ((uVar1 & 2) == 0) {
    fVar21 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar1 | 2;
    (pIVar8->NextWindowData).SizeVal.x = 0.0;
    (pIVar8->NextWindowData).SizeVal.y = fVar21 * 8.0;
    (pIVar8->NextWindowData).SizeCond = 4;
  }
  bVar10 = Begin("Dear ImGui Stack Tool",p_open,0);
  pIVar9 = GImGui;
  if ((!bVar10) ||
     (GImGui->CurrentWindow->WriteAccessed = true, 1 < pIVar9->CurrentWindow->BeginCount)) {
    End();
    return;
  }
  Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar8->HoveredIdPreviousFrame,
       (ulong)pIVar8->ActiveId);
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    (pIVar2->DC).IsSameLine = true;
  }
  MetricsHelpMarker(
                   "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                   );
  fVar21 = (float)pIVar8->Time - (pIVar8->DebugStackTool).CopyToClipboardLastTime;
  v = &(pIVar8->DebugStackTool).CopyToClipboardOnCtrlC;
  Checkbox("Ctrl+C: copy path to clipboard",v);
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    (pIVar2->DC).IsSameLine = true;
  }
  if (((fVar21 < 0.0) || (0.75 <= fVar21)) || (fVar21 = fmodf(fVar21,0.25), 0.125 <= fVar21)) {
    local_138[0].x = 0.0;
    local_138[0].y = 0.0;
    local_138[0].z = 0.0;
    local_138[0].w = 0.0;
  }
  else {
    local_138[0].x = 1.0;
    local_138[0].y = 1.0;
    local_138[0].z = 0.3;
    local_138[0].w = 1.0;
  }
  TextColored(local_138,"*COPIED*");
  if (((*v == true) && (bVar10 = IsKeyDown(ImGuiKey_ModCtrl), bVar10)) &&
     (bVar10 = IsKeyPressed(ImGuiKey_C,0,1), bVar10)) {
    (pIVar8->DebugStackTool).CopyToClipboardLastTime = (float)pIVar8->Time;
    pcVar11 = (pIVar8->TempBuffer).Data;
    iVar14 = (pIVar8->TempBuffer).Size;
    if (3 < iVar14 && 0 < (pIVar8->DebugStackTool).Results.Size) {
      pcVar20 = pcVar11 + iVar14;
      iVar14 = 0;
      pcVar17 = pcVar11;
      do {
        *pcVar17 = '/';
        StackToolFormatLevelInfo(&pIVar8->DebugStackTool,iVar14,false,(char *)local_138,0x100);
        pcVar11 = pcVar17 + 1;
        if (local_138[0].x._0_1_ != '\0') {
          pcVar13 = (char *)((long)&local_138[0].x + 1);
          cVar12 = local_138[0].x._0_1_;
          while (pcVar17 + 3 < pcVar20) {
            pcVar18 = pcVar11;
            if (cVar12 == '/') {
              *pcVar11 = '\\';
              cVar12 = pcVar13[-1];
              pcVar18 = pcVar17 + 2;
            }
            *pcVar18 = cVar12;
            pcVar11 = pcVar18 + 1;
            cVar12 = *pcVar13;
            if (cVar12 == '\0') break;
            pcVar13 = pcVar13 + 1;
            pcVar17 = pcVar18;
          }
        }
        iVar14 = iVar14 + 1;
      } while ((iVar14 < (pIVar8->DebugStackTool).Results.Size) &&
              (pcVar17 = pcVar11, pcVar11 + 3 < pcVar20));
    }
    *pcVar11 = '\0';
    p_Var3 = (GImGui->IO).SetClipboardTextFn;
    if (p_Var3 != (_func_void_void_ptr_char_ptr *)0x0) {
      (*p_Var3)((GImGui->IO).ClipboardUserData,(pIVar8->TempBuffer).Data);
    }
  }
  (pIVar8->DebugStackTool).LastActiveFrame = pIVar8->FrameCount;
  if (0 < (pIVar8->DebugStackTool).Results.Size) {
    local_138[0].x = 0.0;
    local_138[0].y = 0.0;
    bVar10 = BeginTable("##table",3,0x780,(ImVec2 *)local_138,0.0);
    if (bVar10) {
      IVar5 = ImFont::CalcTextSizeA
                        (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,"0xDDDDDDDD",(char *)0x0,
                         (char **)0x0);
      fVar21 = (float)(int)(IVar5.x + 0.99999);
      TableSetupColumn("Seed",0x10,fVar21,0);
      TableSetupColumn("PushID",8,0.0,0);
      TableSetupColumn("Result",0x10,fVar21,0);
      TableHeadersRow();
      if (0 < (pIVar8->DebugStackTool).Results.Size) {
        lVar15 = 0;
        uVar19 = 0;
        do {
          pIVar4 = (pIVar8->DebugStackTool).Results.Data;
          TableNextColumn();
          uVar16 = 0;
          if (uVar19 != 0) {
            uVar16 = (ulong)*(uint *)((pIVar8->DebugStackTool).Results.Data[-1].Desc + lVar15 + -7);
          }
          Text("0x%08X",uVar16);
          TableNextColumn();
          StackToolFormatLevelInfo
                    (&pIVar8->DebugStackTool,(int)uVar19,true,(pIVar8->TempBuffer).Data,
                     (long)(pIVar8->TempBuffer).Size);
          TextUnformatted((pIVar8->TempBuffer).Data,(char *)0x0);
          TableNextColumn();
          Text("0x%08X",(ulong)*(uint *)(pIVar4->Desc + lVar15 + -7));
          iVar14 = (pIVar8->DebugStackTool).Results.Size;
          if (uVar19 == iVar14 - 1) {
            local_138[0].x = (GImGui->Style).Colors[0x18].x;
            local_138[0].y = (GImGui->Style).Colors[0x18].y;
            uVar6 = (GImGui->Style).Colors[0x18].z;
            uVar7 = (GImGui->Style).Colors[0x18].w;
            local_138[0].w = (GImGui->Style).Alpha * (float)uVar7;
            local_138[0].z = (float)uVar6;
            color = ColorConvertFloat4ToU32(local_138);
            TableSetBgColor(3,color,-1);
            iVar14 = (pIVar8->DebugStackTool).Results.Size;
          }
          uVar19 = uVar19 + 1;
          lVar15 = lVar15 + 0x40;
        } while ((long)uVar19 < (long)iVar14);
      }
      EndTable();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiMod_Ctrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer.Data;
        char* p_end = p + g.TempBuffer.Size;
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer.Data);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer.Data, g.TempBuffer.Size);
            TextUnformatted(g.TempBuffer.Data);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}